

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

htmlDocPtr htmlCtxtReadFile(htmlParserCtxtPtr ctxt,char *filename,char *encoding,int options)

{
  xmlParserInputPtr input;
  htmlDocPtr pxVar1;
  
  if (ctxt != (htmlParserCtxtPtr)0x0) {
    htmlCtxtReset(ctxt);
    htmlCtxtSetOptionsInternal(ctxt,options,0x692064);
    input = xmlCtxtNewInputFromUrl(ctxt,filename,(char *)0x0,encoding,0);
    if (input != (xmlParserInputPtr)0x0) {
      pxVar1 = htmlCtxtParseDocument(ctxt,input);
      return pxVar1;
    }
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlCtxtReadFile(htmlParserCtxtPtr ctxt, const char *filename,
                const char *encoding, int options)
{
    xmlParserInputPtr input;

    if (ctxt == NULL)
        return (NULL);

    htmlCtxtReset(ctxt);
    htmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromUrl(ctxt, filename, NULL, encoding, 0);
    if (input == NULL)
        return(NULL);

    return(htmlCtxtParseDocument(ctxt, input));
}